

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_archiver_dir.c
# Opt level: O2

PHYSFS_EnumerateCallbackResult
DIR_enumerate(void *opaque,char *dname,PHYSFS_EnumerateCallback cb,char *origdir,void *callbackdata)

{
  void *callbackdata_00;
  char *origdir_00;
  PHYSFS_EnumerateCallbackResult PVar1;
  size_t sVar2;
  size_t sVar3;
  char *buf;
  ulong len;
  undefined1 *puVar4;
  undefined1 *ptr;
  undefined1 auStack_48 [8];
  void *local_40;
  char *local_38;
  
  puVar4 = auStack_48;
  local_40 = callbackdata;
  local_38 = origdir;
  if (opaque == (void *)0x0) {
    sVar2 = 0;
  }
  else {
    sVar2 = strlen((char *)opaque);
  }
  sVar3 = strlen(dname);
  len = sVar3 + sVar2 + 1;
  if (len < 0x100) {
    puVar4 = auStack_48 + -(sVar3 + sVar2 + 0x18 & 0xfffffffffffffff0);
    ptr = puVar4;
  }
  else {
    ptr = (undefined1 *)0x0;
  }
  *(undefined8 *)(puVar4 + -8) = 0x10bfc4;
  buf = (char *)__PHYSFS_initSmallAlloc(ptr,len);
  *(undefined8 *)(puVar4 + -8) = 0x10bfd8;
  cvtToDependent((char *)opaque,dname,buf,len);
  origdir_00 = local_38;
  callbackdata_00 = local_40;
  if (buf == (char *)0x0) {
    *(undefined8 *)(puVar4 + -8) = 0xffffffffffffffff;
    PVar1 = (PHYSFS_EnumerateCallbackResult)*(undefined8 *)(puVar4 + -8);
  }
  else {
    *(undefined8 *)(puVar4 + -8) = 0x10bff0;
    PVar1 = __PHYSFS_platformEnumerate(buf,cb,origdir_00,callbackdata_00);
    *(undefined8 *)(puVar4 + -8) = 0x10bffa;
    __PHYSFS_smallFree(buf);
  }
  return PVar1;
}

Assistant:

static PHYSFS_EnumerateCallbackResult DIR_enumerate(void *opaque,
                         const char *dname, PHYSFS_EnumerateCallback cb,
                         const char *origdir, void *callbackdata)
{
    char *d;
    PHYSFS_EnumerateCallbackResult retval;
    CVT_TO_DEPENDENT(d, opaque, dname);
    BAIL_IF_ERRPASS(!d, PHYSFS_ENUM_ERROR);
    retval = __PHYSFS_platformEnumerate(d, cb, origdir, callbackdata);
    __PHYSFS_smallFree(d);
    return retval;
}